

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Environment * __thiscall GEO::Environment::get_value(Environment *this,string *name)

{
  ostream *poVar1;
  string *in_RDX;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [54];
  byte local_22;
  undefined1 local_21;
  bool variable_exists;
  string *psStack_20;
  string *name_local;
  Environment *this_local;
  string *value;
  
  local_21 = 0;
  psStack_20 = in_RDX;
  name_local = name;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  local_22 = (**(code **)(*(long *)name + 0x18))(name,psStack_20,this);
  local_22 = local_22 & 1;
  if (local_22 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Environment",&local_59);
    poVar1 = Logger::err((string *)local_58);
    poVar1 = std::operator<<(poVar1,"No such variable: ");
    poVar1 = std::operator<<(poVar1,psStack_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Environment",&local_81);
    poVar1 = Logger::err((string *)local_80);
    poVar1 = std::operator<<(poVar1,"Probably missing CmdLine::import_arg_group(\"...\");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  if ((local_22 & 1) != 0) {
    return this;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"variable_exists",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_d1);
  geo_assertion_failed((string *)local_a8,(string *)local_d0,0x847);
}

Assistant:

std::string Environment::get_value(const std::string& name) const {
        std::string value;
        bool variable_exists = get_value(name, value);
        if(!variable_exists) {
            Logger::err("Environment")
                << "No such variable: " << name
                << std::endl;
            Logger::err("Environment")
                << "Probably missing CmdLine::import_arg_group(\"...\");"
                << std::endl;
        }
        geo_assert(variable_exists);
        return value;
    }